

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

String __thiscall Bstrlib::String::splitUpTo(String *this,String *find,bool includeFind)

{
  int iVar1;
  int iVar2;
  undefined7 in_register_00000011;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  uchar *puVar3;
  String *ret;
  String SVar4;
  
  iVar2 = binstr(&find->super_tagbstring,0,(bstring)CONCAT71(in_register_00000011,includeFind));
  if (iVar2 == -1) {
    String(this,find);
    operator=(find,"");
    puVar3 = extraout_RDX_01;
  }
  else {
    iVar1 = ((bstring)CONCAT71(in_register_00000011,includeFind))->slen;
    midString(this,(int)find,0);
    iVar2 = bdelete(&find->super_tagbstring,0,iVar1 + iVar2);
    puVar3 = extraout_RDX;
    if (iVar2 == -1) {
      splitUpTo();
      puVar3 = extraout_RDX_00;
    }
  }
  SVar4.super_tagbstring.data = puVar3;
  SVar4.super_tagbstring._0_8_ = this;
  return (String)SVar4.super_tagbstring;
}

Assistant:

const String String::splitUpTo(const String & find, const bool includeFind)
    {
        int pos = Find(find, 0);
        if (pos == -1)
        {
            String ret(*this);
            *this = "";
            return ret;
        }
        int size = pos + find.getLength();
        String ret = midString(0, includeFind ? size : pos);
        if (BSTR_ERR == bdelete(this, 0, size)) bstringThrow("Failure in remove");
        return ret;
    }